

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.c
# Opt level: O3

Tag * Tag_new(Location_conflict location,IdGenerator *id_generator,wchar_t *name)

{
  Tag *pTVar1;
  wchar_t *pwVar2;
  
  pTVar1 = (Tag *)malloc(0x28);
  pTVar1->tag_delete = Tag_delete;
  pTVar1->type = Gherkin_Tag;
  (pTVar1->location).line = location.line;
  (pTVar1->location).column = location.column;
  pwVar2 = (*id_generator->new_id)(id_generator);
  pTVar1->id = pwVar2;
  if (name != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(name);
    pTVar1->name = pwVar2;
  }
  return pTVar1;
}

Assistant:

const Tag* Tag_new(Location location, IdGenerator* id_generator, const wchar_t* name) {
    Tag* tag = (Tag*)malloc(sizeof(Tag));
    tag->tag_delete = (item_delete_function)Tag_delete;
    tag->type = Gherkin_Tag;
    tag->location.line = location.line;
    tag->location.column = location.column;
    tag->id = id_generator->new_id(id_generator);
    if (name) {
        tag->name = StringUtilities_copy_string(name);
    }
    return tag;
}